

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O1

void __thiscall
CVmDynamicFunc::CVmDynamicFunc
          (CVmDynamicFunc *this,vm_obj_id_t self,vm_val_t *src,size_t bytecode_len,int obj_ref_cnt)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  int iVar2;
  undefined4 extraout_var;
  uint32_t tmp;
  char *pcVar3;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00327e38;
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,bytecode_len + 0x30 + (long)obj_ref_cnt * 4,this);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  *(int *)(pcVar3 + 0x28) = obj_ref_cnt;
  *(size_t *)(pcVar3 + 0x20) = bytecode_len;
  pcVar3[0] = '\x01';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[0x10] = '\x01';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  (this->super_CVmObject).ext_ = pcVar3;
  if (src != (vm_val_t *)0x0) {
    aVar1 = src->val;
    *(undefined8 *)pcVar3 = *(undefined8 *)src;
    *(anon_union_8_8_cb74652f_for_val *)(pcVar3 + 8) = aVar1;
  }
  *(vm_obj_id_t *)(pcVar3 + (long)*(int *)(pcVar3 + 0x28) * 4 + 0x2c) = self;
  return;
}

Assistant:

CVmDynamicFunc::CVmDynamicFunc(VMG_ vm_obj_id_t self, const vm_val_t *src,
                               size_t bytecode_len, int obj_ref_cnt)
{
    /* allocate our extension structure */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);

    /* store it in the object */
    ext_ = (char *)ext;
    
    /* save the source value */
    if (src != 0)
        ext->src = *src;

    /* set up the code object prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);
}